

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionOperator.cpp
# Opt level: O3

void __thiscall
adios2::plugin::EncryptionOperator::EncryptImpl::GenerateOrReadKey(EncryptImpl *this)

{
  int iVar1;
  runtime_error *this_00;
  fstream keyFile;
  long local_220 [2];
  char local_210 [16];
  byte abStack_200 [496];
  
  std::fstream::fstream(local_220,(this->KeyFilename)._M_dataplus._M_p,_S_out|_S_in);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    std::istream::read((char *)local_220,(long)this->Key);
  }
  else {
    std::fstream::open((char *)local_220,(_Ios_Openmode)(this->KeyFilename)._M_dataplus._M_p);
    if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"couldn\'t open file to write key");
      goto LAB_0010389d;
    }
    crypto_secretbox_keygen(this->Key);
    std::ostream::write(local_210,(long)this->Key);
  }
  std::fstream::close();
  iVar1 = sodium_mlock(this->Key,0x20);
  if (iVar1 != -1) {
    this->KeyValid = true;
    std::fstream::~fstream(local_220);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "Unable to lock memory location of secret key, due to system limit on amount of memory that can be locked by a process."
            );
LAB_0010389d:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GenerateOrReadKey()
    {
        // if the key file already exists, we'll use that key,
        // otherwise we'll generate one and write it out
        std::fstream keyFile(KeyFilename.c_str());
        if (keyFile)
        {
            keyFile.read(reinterpret_cast<char *>(&Key), crypto_secretbox_KEYBYTES);
            keyFile.close();
        }
        else
        {
            keyFile.open(KeyFilename.c_str(), std::fstream::out);
            if (!keyFile)
            {
                throw std::runtime_error("couldn't open file to write key");
            }
            crypto_secretbox_keygen(Key);
            keyFile.write(reinterpret_cast<char *>(&Key), crypto_secretbox_KEYBYTES);
            keyFile.close();
        }

        // lock the key to avoid swapping to disk
        if (sodium_mlock(Key, crypto_secretbox_KEYBYTES) == -1)
        {
            throw std::runtime_error("Unable to lock memory location of secret key,"
                                     " due to system limit on amount of memory that can be locked "
                                     "by a process.");
        }
        KeyValid = true;
    }